

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  uint *puVar1;
  uint uVar2;
  unsigned_long *puVar3;
  rc_data *prVar4;
  ulong uVar5;
  float fVar6;
  rc_size rVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 in_register_000012c4 [12];
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  rVar7.r_size = 0;
  rVar7.c_size = 0;
  if (begin != end) {
    uVar8 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      puVar3 = (this->A).super_bit_array_impl.m_data._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        auVar12 = ZEXT864(0);
        auVar11 = ZEXT864(0);
      }
      else {
        auVar11 = ZEXT864(0);
        auVar12 = ZEXT864(0);
        do {
          uVar2 = *local_38._M_head_impl;
          uVar9 = uVar2 + 0x3f;
          if (-1 < (int)uVar2) {
            uVar9 = uVar2;
          }
          auVar13._0_4_ =
               (float)value_bit_array<-1,_1>::return_value
                      [(uint)(puVar3[(int)uVar9 >> 6] >> ((ulong)uVar2 & 0x3f)) & 1];
          auVar13._4_12_ = in_register_000012c4;
          puVar1 = (uint *)((long)local_38._M_head_impl + 4);
          local_38._M_head_impl = local_38._M_head_impl + 8;
          auVar10 = vfmadd231ss_fma(auVar11._0_16_,auVar13,
                                    ZEXT416((uint)(this->P)._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl[(int)uVar2]));
          auVar11 = ZEXT1664(auVar10);
          auVar10 = vfmadd231ss_fma(auVar12._0_16_,auVar13,
                                    ZEXT416((uint)(this->pi)._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl[(int)*puVar1]));
          auVar12 = ZEXT1664(auVar10);
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      prVar4 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data_*,_false>
               ._M_head_impl;
      prVar4[uVar8].id = (int)uVar8;
      fVar6 = ((this->c->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl[begin->column] - auVar12._0_4_) -
              auVar11._0_4_;
      prVar4[uVar8].value = fVar6;
      uVar2 = begin->value;
      uVar9 = uVar2 + 0x3f;
      if (-1 < (int)uVar2) {
        uVar9 = uVar2;
      }
      uVar5 = puVar3[(int)uVar9 >> 6];
      prVar4[uVar8].f =
           value_bit_array<-1,_1>::return_value[(uint)(uVar5 >> ((ulong)uVar2 & 0x3f)) & 1];
      if ((uVar5 >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        auVar10._8_4_ = 0x80000000;
        auVar10._0_8_ = 0x8000000080000000;
        auVar10._12_4_ = 0x80000000;
        auVar10 = vxorps_avx512vl(ZEXT416((uint)fVar6),auVar10);
        rVar7.r_size = rVar7.r_size + 1;
        rVar7.c_size = 0;
        prVar4[uVar8].value = auVar10._0_4_;
      }
      uVar8 = uVar8 + 1;
      begin = begin + 1;
    } while (begin != end);
    rVar7 = (rc_size)((long)rVar7 << 0x20 | uVar8 & 0xffffffff);
  }
  return rVar7;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }